

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O2

btScalar btEpsRoot(void)

{
  btScalar __x;
  
  if (btEpsRoot()::alreadyCalculated == '\x01') {
    return btEpsRoot::epsroot;
  }
  __x = btMachEps();
  if (__x < 0.0) {
    btEpsRoot::epsroot = sqrtf(__x);
  }
  else {
    btEpsRoot::epsroot = SQRT(__x);
  }
  btEpsRoot()::alreadyCalculated = 1;
  return btEpsRoot::epsroot;
}

Assistant:

btScalar btEpsRoot() {
	
	static btScalar epsroot = 0.;
	static bool alreadyCalculated = false;
	
	if (!alreadyCalculated) {
		epsroot = btSqrt(btMachEps());
		alreadyCalculated = true;
	}
	return epsroot;
}